

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_duplicate_groups.cpp
# Opt level: O2

void __thiscall
duckdb::RemoveDuplicateGroups::VisitOperator(RemoveDuplicateGroups *this,LogicalOperator *op)

{
  LogicalAggregate *aggr;
  
  if (op->type == LOGICAL_AGGREGATE_AND_GROUP_BY) {
    aggr = LogicalOperator::Cast<duckdb::LogicalAggregate>(op);
    VisitAggregate(this,aggr);
  }
  LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
  LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
  return;
}

Assistant:

void RemoveDuplicateGroups::VisitOperator(LogicalOperator &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
		VisitAggregate(op.Cast<LogicalAggregate>());
		break;
	default:
		break;
	}
	LogicalOperatorVisitor::VisitOperatorExpressions(op);
	LogicalOperatorVisitor::VisitOperatorChildren(op);
}